

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_binary.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBinary
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          Precedence minPrecedence)

{
  Expr *pEVar1;
  bool bVar2;
  Token *pTVar3;
  mapped_type *pmVar4;
  Position *pos;
  pointer pEVar5;
  Position *pPVar6;
  Position *pPVar7;
  Precedence in_CL;
  undefined7 in_register_00000011;
  unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *this_00;
  Position local_150;
  undefined1 local_138 [16];
  undefined1 local_128 [23];
  Precedence innerPrec;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_110;
  undefined1 local_108 [8];
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> local_100;
  undefined1 local_f8 [62];
  undefined2 local_ba;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_b8;
  undefined1 local_b0 [20];
  int local_9c;
  Position local_98;
  Position local_80;
  undefined1 local_68 [16];
  Token *closingBracket;
  _Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false> local_50;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_48;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> rhs;
  undefined8 uStack_38;
  TokenType optype;
  Token *op;
  Token *lookahead;
  undefined1 auStack_20 [6];
  Precedence prec;
  Precedence minPrecedence_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs_local;
  Parser *this_local;
  
  this_00 = (unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)
            CONCAT71(in_register_00000011,minPrecedence);
  lookahead._6_1_ = '\0';
  lookahead._7_1_ = in_CL;
  _auStack_20 = this_00;
  lhs_local = lhs;
  this_local = this;
  op = Lexer::getCurrentToken
                 ((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
  do {
    bVar2 = _binary_continue_condition(op,lookahead._7_1_,(Precedence *)((long)&lookahead + 6));
    if (!bVar2) {
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this_00);
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)this;
    }
    uStack_38 = Lexer::getCurrentToken
                          ((Lexer *)(lhs->_M_t).
                                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                    .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    rhs._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ =
         _getOperatorType((Token *)uStack_38);
    if (rhs._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ != TOK_OP_NONE) {
      Lexer::next((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    }
    while( true ) {
      pTVar3 = Lexer::getCurrentToken
                         ((Lexer *)(lhs->_M_t).
                                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                   .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
      bVar2 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar2) break;
      Lexer::next((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    }
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_48);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
         ::find((unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                 *)TOKEN_BRACKETS,
                (key_type *)
                ((long)&rhs._M_t.
                        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                        .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6));
    closingBracket =
         (Token *)std::
                  unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                  ::end((unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                         *)TOKEN_BRACKETS);
    bVar2 = std::__detail::operator!=
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                        *)&closingBracket);
    if (bVar2) {
      if (rhs._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._6_2_ == TOK_OP_BRACKET_OPEN) {
        pTVar3 = Lexer::getCurrentToken
                           ((Lexer *)(lhs->_M_t).
                                     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                     .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
        bVar2 = Token::operator==(pTVar3,TOK_BRACKET_CLOSE);
        if (bVar2) {
          local_68._8_8_ =
               Lexer::getCurrentToken
                         ((Lexer *)(lhs->_M_t).
                                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                   .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
          Lexer::next((Lexer *)(lhs->_M_t).
                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                               .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
          pEVar1 = (lhs->_M_t).
                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                   super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
          pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              this_00);
          pPVar6 = Expr::getPosition(pEVar5);
          pPVar7 = Token::getPosition((Token *)uStack_38);
          Position::operator+(&local_98,pPVar6,pPVar7);
          pPVar6 = Token::getPosition((Token *)local_68._8_8_);
          Position::operator+(&local_80,&local_98,pPVar6);
          std::
          make_unique<pfederc::UnOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                    ((Lexer *)local_68,(Position *)pEVar1,(Token **)&local_80,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     &stack0xffffffffffffffc8);
          std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::operator=
                    (this_00,(unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>
                              *)local_68);
          std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                     local_68);
          op = Lexer::getCurrentToken
                         ((Lexer *)(lhs->_M_t).
                                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                   .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
          local_9c = 2;
          goto LAB_0012765e;
        }
      }
      parseExpression((Parser *)(local_b0 + 8),(Precedence)lhs);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                (&local_48,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_b0 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_b0 + 8));
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
      if (bVar2) {
        pmVar4 = std::
                 unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                 ::at((unordered_map<pfederc::TokenType,_pfederc::TokenType,_std::hash<pfederc::TokenType>,_std::equal_to<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>_>
                       *)TOKEN_BRACKETS,
                      (key_type *)
                      ((long)&rhs._M_t.
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6));
        bVar2 = expect((Parser *)lhs,*pmVar4);
        if (bVar2) {
          op = Lexer::getCurrentToken
                         ((Lexer *)(lhs->_M_t).
                                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                   .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
          goto LAB_0012759c;
        }
        local_ba = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        pPVar6 = (Position *)
                 std::
                 map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                 ::at((map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                       *)STX_ERR_BRACKETS,
                      (key_type *)
                      ((long)&rhs._M_t.
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6));
        pPVar7 = Token::getPosition((Token *)uStack_38);
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           (&local_48);
        pos = Expr::getPosition(pEVar5);
        Position::operator+((Position *)(local_f8 + 8),pPVar7,pos);
        pTVar3 = Lexer::getCurrentToken
                           ((Lexer *)(lhs->_M_t).
                                     super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                     .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
        pPVar7 = Token::getPosition(pTVar3);
        Position::operator+((Position *)(local_f8 + 0x20),(Position *)(local_f8 + 8),pPVar7);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode_const&,pfederc::Position>
                  ((Level *)&local_b8,(SyntaxErrorCode *)&local_ba,pPVar6);
        generateError((Parser *)local_b0,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)lhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_b0);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_b8);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
        local_9c = 1;
      }
      else {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
        local_9c = 1;
      }
    }
    else {
      std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>::
      unique_ptr<std::default_delete<pfederc::Capabilities>,void>
                ((unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>> *)
                 &local_100,(nullptr_t)0x0);
      parsePrimary((Parser *)local_f8,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )lhs);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                (&local_48,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_f8);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_f8);
      std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
      ~unique_ptr(&local_100);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
      if (bVar2) {
        op = Lexer::getCurrentToken
                       ((Lexer *)(lhs->_M_t).
                                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                 .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
        local_128[0xf] = 0;
        while (bVar2 = _binary_inner_continue_condition(op,lookahead._6_1_,local_128 + 0xf), bVar2)
        {
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     (local_138 + 8),&local_48);
          parseBinary((Parser *)local_128,lhs,(char)local_138 + '\b');
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                    (&local_48,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_128);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_128);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     (local_138 + 8));
          op = Lexer::getCurrentToken
                         ((Lexer *)(lhs->_M_t).
                                   super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                   .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
        }
LAB_0012759c:
        pEVar1 = (lhs->_M_t).
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            this_00);
        pPVar6 = Expr::getPosition(pEVar5);
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           (&local_48);
        pPVar7 = Expr::getPosition(pEVar5);
        Position::operator+(&local_150,pPVar6,pPVar7);
        std::
        make_unique<pfederc::BiOpExpr,pfederc::Lexer&,pfederc::Position,pfederc::Token_const*&,pfederc::TokenType&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)local_138,(Position *)pEVar1,(Token **)&local_150,
                   (TokenType *)&stack0xffffffffffffffc8,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                   ((long)&rhs._M_t.
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 6),
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this_00);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::operator=
                  (this_00,(unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *
                           )local_138);
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   local_138);
        local_9c = 0;
      }
      else {
        stack0xfffffffffffffeee = 2;
        local_128._16_4_ = 0;
        Token::getPosition((Token *)uStack_38);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_110,(SyntaxErrorCode *)(local_128 + 0x16),
                   (Position *)(local_128 + 0x10));
        generateError((Parser *)local_108,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)lhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_108);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_110);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
        local_9c = 1;
      }
    }
LAB_0012765e:
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_48);
    if ((local_9c != 0) && (local_9c == 1)) {
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseBinary(std::unique_ptr<Expr> lhs,
    Precedence minPrecedence) noexcept {
  Precedence prec{0};
  Token *lookahead = lexer.getCurrentToken();
  while (_binary_continue_condition(*lookahead, minPrecedence, prec)) {
    const Token *op = lexer.getCurrentToken();
    TokenType optype = _getOperatorType(*op);
    if (optype != TokenType::TOK_OP_NONE)
      lexer.next(); // advance to next unprocessed token
    
    // ignore newline tokens
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();

    std::unique_ptr<Expr> rhs;
    if (TOKEN_BRACKETS.find(optype) != TOKEN_BRACKETS.end()) {
      if (optype == TokenType::TOK_OP_BRACKET_OPEN
          && *lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
        // empty function call, because ()
        const Token *const closingBracket = lexer.getCurrentToken();
        lexer.next(); // eat )
        lhs = std::make_unique<UnOpExpr>(lexer,
          lhs->getPosition() + op->getPosition() + closingBracket->getPosition(),
          op, std::move(lhs));

        lookahead = lexer.getCurrentToken();

        continue;
      } else {
        rhs = parseExpression();
        if (!rhs)
          return nullptr;

        if (!expect(TOKEN_BRACKETS.at(optype))) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            STX_ERR_BRACKETS.at(optype),
            op->getPosition() + rhs->getPosition() +
            lexer.getCurrentToken()->getPosition()));
          return nullptr;
        }
      }

      lookahead = lexer.getCurrentToken();
    } else {
      rhs = parsePrimary();
      if (!rhs) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_PRIMARY_EXPR, op->getPosition()));
          
        return nullptr;
      }

      // lexer already on unprocessed token
      lookahead = lexer.getCurrentToken();
      Precedence innerPrec{0};
      while (_binary_inner_continue_condition(*lookahead, prec, innerPrec)) {
        rhs = parseBinary(std::move(rhs), innerPrec);
        lookahead = lexer.getCurrentToken();
      }
    }

    lhs = std::make_unique<BiOpExpr>(lexer,
      lhs->getPosition() + rhs->getPosition(),
      op, optype, std::move(lhs), std::move(rhs));
  }

  return lhs;
}